

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QCom.cpp
# Opt level: O2

void server::pm_cmd(int cid,char **args,int argc)

{
  uint cn;
  uint uVar1;
  int iVar2;
  char *pcVar3;
  clientinfo *ci;
  clientinfo *ci_00;
  char *pcVar4;
  stringformatter local_250;
  string senderpmconf;
  string recieverpmmsg;
  
  if (args[1] != (char *)0x0) {
    pcVar3 = QServ::getFullText(&qs);
    if (*pcVar3 != '\0') {
      cn = atoi(args[1]);
      ci = QServ::getClient(&qs,cn);
      pcVar3 = QServ::getFullText(&qs);
      if (*pcVar3 != '\0') {
        uVar1 = QServ::getSender(&qs);
        if ((((cn < 0x81) && (ci != (clientinfo *)0x0)) && (cn != uVar1)) &&
           (args[1] != (char *)0x0)) {
          iVar2 = QServ::getSender(&qs);
          ci_00 = QServ::getClient(&qs,iVar2);
          pcVar3 = QServ::getFullText(&qs);
          if (((*pcVar3 != '\0') && (ci->connected == true)) && (args[1] != (char *)0x0)) {
            pcVar3 = QServ::getFullText(&qs);
            senderpmconf._0_8_ = recieverpmmsg;
            pcVar4 = colorname(ci_00);
            stringformatter::operator()
                      ((stringformatter *)senderpmconf,"\f7Private message from \f0%s\f7:\f3%s",
                       pcVar4,pcVar3 + 1);
            sendf(cn,1,"ris",0x23,recieverpmmsg);
            local_250.buf = senderpmconf;
            pcVar4 = colorname(ci);
            stringformatter::operator()
                      (&local_250,"\f7Sent \f0%s \f7your message:\f3%s",pcVar4,pcVar3 + 1);
            iVar2 = QServ::getSender(&qs);
            sendf(iVar2,1,"ris",0x23,(stringformatter *)senderpmconf);
          }
        }
      }
      return;
    }
  }
  iVar2 = QServ::getSender(&qs);
  pcVar3 = QServ::getCommandDesc(&qs,cid);
  sendf(iVar2,1,"ris",0x23,pcVar3);
  return;
}

Assistant:

QSERV_CALLBACK pm_cmd(p) {
        int cn = -1;
        if(args[1] != NULL && strlen(fulltext) > 0) {
            cn = atoi(args[1]);
            clientinfo *ci = qs.getClient(cn);
            if(strlen(fulltext) > 0 && cn!=CMD_SENDER && ci != NULL && cn >= 0 && cn <= 128 && args[1] != NULL) {
                clientinfo *self = qs.getClient(CMD_SENDER);
                if(strlen(fulltext) > 0 && ci->connected && args[1] != NULL && ci != NULL) {
                    char* privatemessage = fulltext + 1; //ommit cn from fulltext
                    defformatstring(recieverpmmsg)("\f7Private message from \f0%s\f7:\f3%s", colorname(self), privatemessage);
                    sendf(cn, 1, "ris", N_SERVMSG, recieverpmmsg);
                    defformatstring(senderpmconf)("\f7Sent \f0%s \f7your message:\f3%s", colorname(ci), privatemessage);
                    sendf(CMD_SENDER, 1, "ris", N_SERVMSG, senderpmconf);
                }
            }
        } else {
            sendf(CMD_SENDER, 1, "ris", N_SERVMSG, CMD_DESC(cid));
        }
    }